

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_append.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream_00;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  size_t sStack_190a0;
  sockaddr_in sin;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  char mem [102400];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((password = argv[3], argc != 4 && (loclfile = argv[4], 5 < (uint)argc)))) {
      sftppath = argv[5];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __stream_00 = fopen(loclfile,"rb");
  if (__stream_00 == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket!\n",0x19,1,_stderr);
    goto LAB_001015d2;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      pcVar11 = "Could not initialize SSH session!\n";
      sStack_190a0 = 0x22;
      goto LAB_0010145b;
    }
    libssh2_session_set_blocking(lVar5,1);
    uVar3 = libssh2_session_handshake(lVar5,__fd);
    if (uVar3 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar12));
      }
      fputc(10,_stderr);
      pcVar11 = username;
      sVar7 = strlen(username);
      pcVar1 = password;
      sVar8 = strlen(password);
      iVar4 = libssh2_userauth_password_ex
                        (lVar5,pcVar11,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
      if (iVar4 == 0) {
        fwrite("libssh2_sftp_init()!\n",0x15,1,_stderr);
        lVar6 = libssh2_sftp_init(lVar5);
        if (lVar6 == 0) {
          pcVar11 = "Unable to init SFTP session\n";
          sStack_190a0 = 0x1c;
LAB_0010157e:
          fwrite(pcVar11,sStack_190a0,1,_stderr);
        }
        else {
          fwrite("libssh2_sftp_open() for READ and WRITE!\n",0x28,1,_stderr);
          pcVar11 = sftppath;
          sVar7 = strlen(sftppath);
          lVar12 = libssh2_sftp_open_ex(lVar6,pcVar11,sVar7 & 0xffffffff,3,0x1a4,0);
          __stream = _stderr;
          if (lVar12 == 0) {
            uVar9 = libssh2_sftp_last_error();
            fprintf(__stream,"Unable to open file with SFTP: %ld\n",uVar9);
          }
          else {
            iVar4 = libssh2_sftp_fstat_ex(lVar12,&attrs,0);
            if (iVar4 < 0) {
              pcVar11 = "libssh2_sftp_fstat_ex failed\n";
              sStack_190a0 = 0x1d;
              goto LAB_0010157e;
            }
            libssh2_sftp_seek64(lVar12,attrs.filesize);
            fprintf(_stderr,"Did a seek to position %ld\n",attrs.filesize);
            fwrite("libssh2_sftp_open() a handle for APPEND\n",0x28,1,_stderr);
            fwrite("libssh2_sftp_open() is done, now send data!\n",0x2c,1,_stderr);
            do {
              sVar7 = fread(mem,1,0x19000,__stream_00);
              pcVar11 = mem;
              if (sVar7 == 0) break;
              do {
                lVar10 = libssh2_sftp_write(lVar12,pcVar11,sVar7);
                if (lVar10 < 0) break;
                sVar7 = sVar7 - lVar10;
                pcVar11 = pcVar11 + lVar10;
              } while (sVar7 != 0);
            } while (0 < lVar10);
            libssh2_sftp_close_handle(lVar12);
            libssh2_sftp_shutdown(lVar6);
          }
        }
      }
      else {
        fwrite("Authentication by password failed!\n",0x23,1,_stderr);
      }
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
    }
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  else {
    pcVar11 = "failed to connect!\n";
    sStack_190a0 = 0x13;
LAB_0010145b:
    fwrite(pcVar11,sStack_190a0,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_001015d2:
  fclose(__stream_00);
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
    LIBSSH2_SFTP_ATTRIBUTES attrs;
    char mem[1024 * 100];
    FILE *local;
    size_t nread;
    ssize_t nwritten;
    char *ptr;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        sftppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() for READ and WRITE!\n");
    /* Request a file via SFTP */
    sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                    LIBSSH2_FXF_WRITE |
                                    LIBSSH2_FXF_READ,
                                    LIBSSH2_SFTP_S_IRUSR |
                                    LIBSSH2_SFTP_S_IWUSR |
                                    LIBSSH2_SFTP_S_IRGRP |
                                    LIBSSH2_SFTP_S_IROTH);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    if(libssh2_sftp_fstat_ex(sftp_handle, &attrs, 0) < 0) {
        fprintf(stderr, "libssh2_sftp_fstat_ex failed\n");
        goto shutdown;
    }
    else
        libssh2_sftp_seek64(sftp_handle, attrs.filesize);
    fprintf(stderr, "Did a seek to position %ld\n", (long) attrs.filesize);

    fprintf(stderr, "libssh2_sftp_open() a handle for APPEND\n");
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() is done, now send data!\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            /* write data in a loop until we block */
            nwritten = libssh2_sftp_write(sftp_handle, ptr, nread);
            if(nwritten < 0)
                break;
            ptr += nwritten;
            nread -= nwritten;
        } while(nread);

    } while(nwritten > 0);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}